

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# chess.cpp
# Opt level: O0

void __thiscall banksia::ChessBoard::clearCastleRights(ChessBoard *this,int rookPos,Side rookSide)

{
  Side rookSide_local;
  int rookPos_local;
  ChessBoard *this_local;
  
  if (rookPos == 0) {
    if (rookSide == black) {
      this->castleRights[0] = this->castleRights[0] & ((byte)this->CastleRight_long ^ 0xff);
    }
  }
  else if (rookPos == 7) {
    if (rookSide == black) {
      this->castleRights[0] = this->castleRights[0] & ((byte)this->CastleRight_short ^ 0xff);
    }
  }
  else if (rookPos == 0x38) {
    if (rookSide == white) {
      this->castleRights[1] = this->castleRights[1] & ((byte)this->CastleRight_long ^ 0xff);
    }
  }
  else if ((rookPos == 0x3f) && (rookSide == white)) {
    this->castleRights[1] = this->castleRights[1] & ((byte)this->CastleRight_short ^ 0xff);
  }
  return;
}

Assistant:

void ChessBoard::clearCastleRights(int rookPos, Side rookSide) {
    switch (rookPos) {
        case 0:
            if (rookSide == Side::black) {
                castleRights[B] &= ~CastleRight_long;
            }
            break;
        case 7:
            if (rookSide == Side::black) {
                castleRights[B] &= ~CastleRight_short;
            }
            break;
        case 56:
            if (rookSide == Side::white) {
                castleRights[W] &= ~CastleRight_long;
            }
            break;
        case 63:
            if (rookSide == Side::white) {
                castleRights[W] &= ~CastleRight_short;
            }
            break;
    }
}